

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

int64_t read_int(MIR_context_t ctx,char *err_msg)

{
  uint8_t uVar1;
  VARR_uint8_t *pVVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int64_t iVar6;
  uint8_t *extraout_RAX;
  uint8_t *__ptr;
  MIR_context_t __ptr_00;
  MIR_insn_t_conflict pMVar7;
  int64_t extraout_RAX_00;
  MIR_context_t pMVar8;
  MIR_context_t extraout_RDX;
  char *pcVar9;
  MIR_context_t label_num;
  MIR_context_t pMVar10;
  MIR_context_t ctx_00;
  size_t sVar11;
  ulong uVar12;
  MIR_context_t pMVar13;
  ulong uVar14;
  VARR_MIR_label_t *pVVar15;
  
  iVar4 = get_byte(ctx);
  if (0xfffffff7 < iVar4 - 0x11U) {
    uVar12 = 0;
    uVar14 = 0;
    do {
      iVar5 = get_byte(ctx);
      uVar3 = uVar12 & 0x3f;
      uVar12 = uVar12 + 8;
      uVar14 = uVar14 | (long)iVar5 << uVar3;
    } while ((ulong)(iVar4 - 8) << 3 != uVar12);
    return uVar14;
  }
  ctx_00 = (MIR_context_t)&DAT_00000002;
  iVar6 = (*ctx->error_func)(MIR_binary_io_error,err_msg);
  if ((ctx_00 != (MIR_context_t)0x0) && (ctx_00->error_func != (MIR_error_func_t)0x0)) {
    ctx_00->gen_ctx = (gen_ctx *)0x0;
    return iVar6;
  }
  VARR_uint8_ttrunc_cold_1();
  __ptr = extraout_RAX;
  if (extraout_RDX != (MIR_context_t)0x0) {
    pMVar10 = (MIR_context_t)0x0;
    label_num = (MIR_context_t)err_msg;
    do {
      pVVar2 = ctx_00->temp_data;
      __ptr = pVVar2->varr;
      if (__ptr == (uint8_t *)0x0) {
        push_data_cold_1();
        if (ctx_00 != (MIR_context_t)0x0) {
          return (int64_t)ctx_00->gen_ctx;
        }
        VARR_uint8_tlength_cold_1();
        if (ctx_00 != (MIR_context_t)0x0) {
          return (int64_t)ctx_00->error_func;
        }
        VARR_uint8_taddr_cold_1();
        pVVar15 = ctx_00->io_ctx->func_labels;
        pMVar10 = label_num;
        pMVar13 = ctx_00;
        pMVar8 = extraout_RDX;
        if (pVVar15 != (VARR_MIR_label_t *)0x0) goto LAB_0013e943;
        goto LAB_0013e9a5;
      }
      sVar11 = pVVar2->els_num;
      uVar1 = *(uint8_t *)((long)&pMVar10->gen_ctx + (long)&((MIR_context_t)err_msg)->gen_ctx);
      ctx = (MIR_context_t)CONCAT71((int7)((ulong)ctx >> 8),uVar1);
      uVar12 = sVar11 + 1;
      if (pVVar2->size < uVar12) {
        pMVar13 = (MIR_context_t)((uVar12 >> 1) + uVar12);
        label_num = pMVar13;
        __ptr = (uint8_t *)realloc(__ptr,(size_t)pMVar13);
        pVVar2->varr = __ptr;
        pVVar2->size = (size_t)pMVar13;
        sVar11 = pVVar2->els_num;
        uVar12 = sVar11 + 1;
      }
      pMVar10 = (MIR_context_t)((long)&pMVar10->gen_ctx + 1);
      pVVar2->els_num = uVar12;
      __ptr[sVar11] = uVar1;
    } while (extraout_RDX != pMVar10);
  }
  return (int64_t)__ptr;
  while( true ) {
    __ptr_00 = (MIR_context_t)pVVar15->varr;
    if (__ptr_00 == (MIR_context_t)0x0) {
      to_lab_cold_1();
      goto LAB_0013e9fa;
    }
    pcVar9 = (char *)((long)&pMVar8->gen_ctx + 1);
    if ((char *)pVVar15->size < pcVar9) {
      pMVar10 = (MIR_context_t)((long)(pcVar9 + ((ulong)pcVar9 >> 1)) * 8);
      pMVar13 = __ptr_00;
      __ptr_00 = (MIR_context_t)realloc(__ptr_00,(size_t)pMVar10);
      pVVar15->varr = (MIR_label_t *)__ptr_00;
      pVVar15->size = (size_t)(pcVar9 + ((ulong)pcVar9 >> 1));
      pMVar8 = (MIR_context_t)pVVar15->els_num;
      pcVar9 = (char *)((long)&pMVar8->gen_ctx + 1);
    }
    pVVar15->els_num = (size_t)pcVar9;
    (&__ptr_00->gen_ctx)[(long)pMVar8] = (gen_ctx *)0x0;
    pVVar15 = ctx_00->io_ctx->func_labels;
    ctx = label_num;
    pMVar8 = ctx_00;
    if (pVVar15 == (VARR_MIR_label_t *)0x0) break;
LAB_0013e943:
    pMVar8 = (MIR_context_t)pVVar15->els_num;
    if (label_num < pMVar8) goto LAB_0013e9aa;
  }
LAB_0013e9a5:
  ctx_00 = pMVar8;
  label_num = ctx;
  to_lab_cold_4();
LAB_0013e9aa:
  if (pVVar15->varr == (MIR_label_t *)0x0) {
LAB_0013e9ff:
    to_lab_cold_3();
    pMVar13->io_ctx->io_file = (FILE *)pMVar10;
    MIR_read_with_func(pMVar13,file_reader);
    return extraout_RAX_00;
  }
  pMVar7 = pVVar15->varr[(long)label_num];
  if (pMVar7 == (MIR_insn_t_conflict)0x0) {
    pMVar10 = label_num;
    pMVar13 = ctx_00;
    pMVar7 = create_label(ctx_00,(int64_t)label_num);
    pVVar15 = ctx_00->io_ctx->func_labels;
    if (((pVVar15 == (VARR_MIR_label_t *)0x0) || (pVVar15->varr == (MIR_label_t *)0x0)) ||
       ((MIR_context_t)pVVar15->els_num <= label_num)) {
LAB_0013e9fa:
      to_lab_cold_2();
      goto LAB_0013e9ff;
    }
    pVVar15->varr[(long)label_num] = pMVar7;
  }
  return (int64_t)pMVar7;
}

Assistant:

static int64_t read_int (MIR_context_t ctx, const char *err_msg) {
  int c = get_byte (ctx);

  if (TAG_I1 > c || c > TAG_I8) MIR_get_error_func (ctx) (MIR_binary_io_error, err_msg);
  return get_int (ctx, c - TAG_I1 + 1);
}